

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Set * skiwi::make_set(Set *__return_storage_ptr__,
                     vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer ptVar4;
  pointer ptVar5;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *in_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  string local_1c0;
  token tok;
  string local_170;
  string local_150;
  string name;
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  local_110;
  
  ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar5 == ptVar4) {
    anon_unknown_2::throw_parse_error(no_tokens);
    ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar4 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    in_RDX = extraout_RDX;
  }
  if ((ptVar5 == ptVar4) || (ptVar4[-1].type != T_ID)) {
    iVar1 = ptVar4[-1].line_nr;
    iVar2 = ptVar4[-1].column_nr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"",(allocator<char> *)&local_110);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,bad_syntax,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    in_RDX = extraout_RDX_00;
  }
  (anonymous_namespace)::current_abi_cxx11_(&name,(_anonymous_namespace_ *)tokens,in_RDX);
  Set::Set(__return_storage_ptr__);
  ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = ptVar5[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar5[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar1;
  bVar3 = std::operator!=(&name,"set!");
  if (bVar3) {
    ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar1 = ptVar5[-1].line_nr;
    iVar2 = ptVar5[-1].column_nr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"set!",(allocator<char> *)&local_110);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
  }
  anon_unknown_2::advance(tokens);
  anon_unknown_2::take(&tok,tokens);
  if (tok.type != T_ID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"",(allocator<char> *)&local_110);
    anon_unknown_2::throw_parse_error(tok.line_nr,tok.column_nr,invalid_variable_name,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
  make_expression((Expression *)&local_110,tokens);
  std::
  vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
  ::
  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>
            ((vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
              *)&__return_storage_ptr__->value,
             (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              *)&local_110);
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage(&local_110);
  std::__cxx11::string::~string((string *)&tok.value);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

Set make_set(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  std::string name = current(tokens);
  Set s;
  s.line_nr = tokens.back().line_nr;
  s.column_nr = tokens.back().column_nr;
  if (name != "set!")
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, expected_keyword, "set!");
  advance(tokens);
  auto tok = take(tokens);
  if (tok.type != token::T_ID)
    throw_parse_error(tok.line_nr, tok.column_nr, invalid_variable_name);
  s.name = tok.value;
  s.value.push_back(make_expression(tokens));
  return s;
  }